

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O3

char * test_matrix2_transformation_scalingv2(void)

{
  int iVar1;
  char *pcVar2;
  vector2 expectedPosition;
  vector2 scale;
  vector2 startingPosition;
  matrix2 transform;
  anon_union_16_2_12391dad_for_vector2_0 local_68;
  anon_union_16_2_12391dad_for_vector2_0 local_58;
  anon_union_16_2_12391dad_for_vector2_0 local_48;
  matrix2 local_38;
  
  local_48.v[0] = 0.0;
  local_48.v[1] = 1.0;
  local_58.v[0] = 0.10000000149011612;
  local_58.v[1] = 0.10000000149011612;
  local_68.v[0] = 0.0;
  local_68.v[1] = 0.10000000149011612;
  matrix2_make_transformation_scalingv2(&local_38,(vector2 *)&local_58.field_1);
  vector2_multiplym2((vector2 *)&local_48.field_1,&local_38);
  iVar1 = vector2_equals((vector2 *)&local_48.field_1,(vector2 *)&local_68.field_1);
  pcVar2 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(225) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
    ;
  }
  return pcVar2;
}

Assistant:

static char *test_matrix2_transformation_scalingv2(void)
{
	struct matrix2 transform;

	struct vector2 startingPosition = {0.0f, 1.0f};
	struct vector2 scale = {0.1f, 0.1f};
	struct vector2 expectedPosition = {0.0f, 0.1f};

	matrix2_make_transformation_scalingv2(&transform, &scale);
	vector2_multiplym2(&startingPosition, &transform);
	test_assert(vector2_equals(&startingPosition, &expectedPosition));

	return NULL;
}